

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es31cLayoutBindingTests.cpp
# Opt level: O1

LayoutBindingTestResult * __thiscall
glcts::LayoutBindingBaseCase::binding_examples
          (LayoutBindingTestResult *__return_storage_ptr__,LayoutBindingBaseCase *this)

{
  undefined1 local_20 [16];
  
  local_20[0] = 0;
  __return_storage_ptr__->m_passed = true;
  __return_storage_ptr__->m_notRunForThisContext = false;
  (__return_storage_ptr__->m_reason)._M_dataplus._M_p =
       (pointer)&(__return_storage_ptr__->m_reason).field_2;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&__return_storage_ptr__->m_reason,local_20,local_20);
  return __return_storage_ptr__;
}

Assistant:

LayoutBindingTestResult LayoutBindingBaseCase::binding_examples(void)
{
	return true;
}